

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater_impl.hpp
# Opt level: O3

void __thiscall
hiberlite::UpdateBean::notifyInitWalk<hiberlite::AVisitor<hiberlite::UpdateBean>>
          (UpdateBean *this,AVisitor<hiberlite::UpdateBean> *av)

{
  pointer pcVar1;
  string local_90;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  int local_30;
  
  pcVar1 = (av->scope)._table._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (av->scope)._table._M_string_length);
  pcVar1 = (av->scope)._prefix._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + (av->scope)._prefix._M_string_length);
  local_30 = (av->scope).prefix_depth;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_70,local_70 + local_68);
  startRow(this,&local_90,(av->rootKey).id,-1,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void UpdateBean::notifyInitWalk(AV& av)
{
	startRow(av.getScope().table(), av.getRootId(), Database::NULL_ID,0);
}